

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.hpp
# Opt level: O0

bool LoaderLogger::LogErrorMessage
               (string *command_name,string *message,
               vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  bool bVar1;
  LoaderLogger *this;
  allocator local_41;
  string local_40;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *local_20;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects_local;
  string *message_local;
  string *command_name_local;
  
  local_20 = objects;
  objects_local = (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)message;
  message_local = command_name;
  this = GetInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"OpenXR-Loader",&local_41);
  bVar1 = LogMessage(this,0x1000,1,&local_40,message_local,(string *)objects_local,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return bVar1;
}

Assistant:

static bool LogErrorMessage(const std::string& command_name, const std::string& message,
                                const std::vector<XrSdkLogObjectInfo>& objects = {}) {
        return GetInstance().LogMessage(XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT, XR_LOADER_LOG_MESSAGE_TYPE_GENERAL_BIT,
                                        "OpenXR-Loader", command_name, message, objects);
    }